

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O0

int32_t ucnv_extMatchToU(int32_t *cx,int8_t sisoState,char *pre,int32_t preLength,char *src,
                        int32_t srcLength,uint32_t *pMatchValue,UBool param_8,UBool flush)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint *puVar4;
  uint8_t local_6d;
  int local_6c;
  uint8_t b;
  int32_t matchLength;
  int32_t length;
  int32_t idx;
  int32_t j;
  int32_t i;
  uint32_t matchValue;
  uint32_t value;
  uint32_t *toUSection;
  uint32_t *toUTable;
  int32_t srcLength_local;
  char *src_local;
  int32_t preLength_local;
  char *pre_local;
  int8_t sisoState_local;
  int32_t *cx_local;
  
  if ((cx == (int32_t *)0x0) || (cx[2] < 1)) {
    cx_local._4_4_ = 0;
  }
  else {
    iVar1 = cx[1];
    matchLength = 0;
    j = 0;
    local_6c = 0;
    length = 0;
    idx = 0;
    toUTable._4_4_ = srcLength;
    if (sisoState == '\0') {
      if (1 < preLength) {
        return 0;
      }
      if (preLength == 1) {
        toUTable._4_4_ = 0;
      }
      else if (1 < srcLength) {
        toUTable._4_4_ = 1;
      }
      flush = '\x01';
    }
    do {
      puVar4 = (uint *)((long)cx + (long)matchLength * 4 + (long)iVar1);
      uVar2 = *puVar4;
      uVar3 = uVar2 & 0xffffff;
      if ((uVar3 != 0) && ((sisoState < '\0' || ((sisoState == '\0') == (idx + length == 1))))) {
        local_6c = idx + length;
        j = uVar3;
      }
      if (idx < preLength) {
        local_6d = pre[idx];
        idx = idx + 1;
      }
      else {
        if (toUTable._4_4_ <= length) {
          if ((flush == '\0') && (idx + length < 0x20)) {
            return -(idx + length);
          }
          goto LAB_0040aadb;
        }
        local_6d = src[length];
        length = length + 1;
      }
      matchLength = ucnv_extFindToU(puVar4 + 1,uVar2 >> 0x18,local_6d);
      if (matchLength == 0) goto LAB_0040aadb;
    } while ((uint)matchLength < 0x1f0000);
    if ((sisoState < '\0') || ((sisoState == '\0') == (idx + length == 1))) {
      local_6c = idx + length;
      j = matchLength;
    }
LAB_0040aadb:
    if (local_6c == 0) {
      cx_local._4_4_ = 0;
    }
    else {
      *pMatchValue = j & 0xff7fffff;
      cx_local._4_4_ = local_6c;
    }
  }
  return cx_local._4_4_;
}

Assistant:

static int32_t
ucnv_extMatchToU(const int32_t *cx, int8_t sisoState,
                 const char *pre, int32_t preLength,
                 const char *src, int32_t srcLength,
                 uint32_t *pMatchValue,
                 UBool /*useFallback*/, UBool flush) {
    const uint32_t *toUTable, *toUSection;

    uint32_t value, matchValue;
    int32_t i, j, idx, length, matchLength;
    uint8_t b;

    if(cx==NULL || cx[UCNV_EXT_TO_U_LENGTH]<=0) {
        return 0; /* no extension data, no match */
    }

    /* initialize */
    toUTable=UCNV_EXT_ARRAY(cx, UCNV_EXT_TO_U_INDEX, uint32_t);
    idx=0;

    matchValue=0;
    i=j=matchLength=0;

    if(sisoState==0) {
        /* SBCS state of an SI/SO stateful converter, look at only exactly 1 byte */
        if(preLength>1) {
            return 0; /* no match of a DBCS sequence in SBCS mode */
        } else if(preLength==1) {
            srcLength=0;
        } else /* preLength==0 */ {
            if(srcLength>1) {
                srcLength=1;
            }
        }
        flush=TRUE;
    }

    /* we must not remember fallback matches when not using fallbacks */

    /* match input units until there is a full match or the input is consumed */
    for(;;) {
        /* go to the next section */
        toUSection=toUTable+idx;

        /* read first pair of the section */
        value=*toUSection++;
        length=UCNV_EXT_TO_U_GET_BYTE(value);
        value=UCNV_EXT_TO_U_GET_VALUE(value);
        if( value!=0 &&
            (UCNV_EXT_TO_U_IS_ROUNDTRIP(value) ||
             TO_U_USE_FALLBACK(useFallback)) &&
            UCNV_EXT_TO_U_VERIFY_SISO_MATCH(sisoState, i+j)
        ) {
            /* remember longest match so far */
            matchValue=value;
            matchLength=i+j;
        }

        /* match pre[] then src[] */
        if(i<preLength) {
            b=(uint8_t)pre[i++];
        } else if(j<srcLength) {
            b=(uint8_t)src[j++];
        } else {
            /* all input consumed, partial match */
            if(flush || (length=(i+j))>UCNV_EXT_MAX_BYTES) {
                /*
                 * end of the entire input stream, stop with the longest match so far
                 * or: partial match must not be longer than UCNV_EXT_MAX_BYTES
                 * because it must fit into state buffers
                 */
                break;
            } else {
                /* continue with more input next time */
                return -length;
            }
        }

        /* search for the current UChar */
        value=ucnv_extFindToU(toUSection, length, b);
        if(value==0) {
            /* no match here, stop with the longest match so far */
            break;
        } else {
            if(UCNV_EXT_TO_U_IS_PARTIAL(value)) {
                /* partial match, continue */
                idx=(int32_t)UCNV_EXT_TO_U_GET_PARTIAL_INDEX(value);
            } else {
                if( (UCNV_EXT_TO_U_IS_ROUNDTRIP(value) ||
                     TO_U_USE_FALLBACK(useFallback)) &&
                    UCNV_EXT_TO_U_VERIFY_SISO_MATCH(sisoState, i+j)
                ) {
                    /* full match, stop with result */
                    matchValue=value;
                    matchLength=i+j;
                } else {
                    /* full match on fallback not taken, stop with the longest match so far */
                }
                break;
            }
        }
    }

    if(matchLength==0) {
        /* no match at all */
        return 0;
    }

    /* return result */
    *pMatchValue=UCNV_EXT_TO_U_MASK_ROUNDTRIP(matchValue);
    return matchLength;
}